

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriggerVariable.hpp
# Opt level: O0

void __thiscall gmlc::concurrency::TriggerVariable::waitActivation(TriggerVariable *this)

{
  bool bVar1;
  anon_class_8_1_8991fb9c in_RDI;
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> *in_stack_ffffffffffffffd0;
  condition_variable *in_stack_ffffffffffffffd8;
  
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffd0,(mutex_type *)in_RDI.this);
  bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffffd8);
  if (!bVar1) {
    std::condition_variable::
    wait<gmlc::concurrency::TriggerVariable::waitActivation()const::_lambda()_1_>
              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_RDI);
  }
  std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void waitActivation() const
    {
        std::unique_lock<std::mutex> lk(activeLock);
        if (!activated) {
            cv_active.wait(lk, [this] { return activated.load(); });
        }
    }